

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::DirectoryExists(FilePath *this)

{
  int iVar1;
  char *path_00;
  bool local_b1;
  undefined1 local_b0 [8];
  StatStruct file_stat;
  FilePath *path;
  bool result;
  FilePath *this_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)this;
  path_00 = c_str(this);
  iVar1 = posix::Stat(path_00,(StatStruct *)local_b0);
  local_b1 = false;
  if (iVar1 == 0) {
    local_b1 = posix::IsDir((StatStruct *)local_b0);
  }
  return local_b1;
}

Assistant:

bool FilePath::DirectoryExists() const {
  bool result = false;
#if GTEST_OS_WINDOWS
  // Don't strip off trailing separator if path is a root directory on
  // Windows (like "C:\\").
  const FilePath& path(IsRootDirectory() ? *this :
                                           RemoveTrailingPathSeparator());
#else
  const FilePath& path(*this);
#endif

#if GTEST_OS_WINDOWS_MOBILE
  LPCWSTR unicode = String::AnsiToUtf16(path.c_str());
  const DWORD attributes = GetFileAttributes(unicode);
  delete [] unicode;
  if ((attributes != kInvalidFileAttributes) &&
      (attributes & FILE_ATTRIBUTE_DIRECTORY)) {
    result = true;
  }
#else
  posix::StatStruct file_stat;
  result = posix::Stat(path.c_str(), &file_stat) == 0 &&
      posix::IsDir(file_stat);
#endif  // GTEST_OS_WINDOWS_MOBILE

  return result;
}